

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::TaskInterface::complete(TaskInterface *this,ValueType *value,bool forceChange)

{
  Task *task;
  bool forceChange_local;
  ValueType *value_local;
  TaskInterface *this_local;
  
  anon_unknown.dwarf_33c573::BuildEngineImpl::taskIsComplete
            ((BuildEngineImpl *)this->impl,(Task *)this->ctx,value,forceChange);
  return;
}

Assistant:

void TaskInterface::complete(ValueType &&value, bool forceChange) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskIsComplete(task, std::move(value),
                                                      forceChange);
}